

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFontCache::increaseCost(QFontCache *this,uint cost)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  duration<long,_std::ratio<1L,_1L>_> *__d;
  int in_ESI;
  Duration in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = in_ESI + 0x200U >> 10;
  if (uVar3 == 0) {
    uVar3 = 1;
  }
  *(uint *)(in_RDI.__r + 0x28) = uVar3 + *(int *)(in_RDI.__r + 0x28);
  if (((*(uint *)(in_RDI.__r + 0x2c) < *(uint *)(in_RDI.__r + 0x28)) &&
      (*(undefined4 *)(in_RDI.__r + 0x2c) = *(undefined4 *)(in_RDI.__r + 0x28),
      (*(byte *)(in_RDI.__r + 0x35) & 1) != 0)) &&
     ((bVar2 = QBasicTimer::isActive((QBasicTimer *)(in_RDI.__r + 0x38)), !bVar2 ||
      ((*(byte *)(in_RDI.__r + 0x34) & 1) == 0)))) {
    __d = (duration<long,_std::ratio<1L,_1L>_> *)(in_RDI.__r + 0x38);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)
               CONCAT44(uVar3,in_stack_ffffffffffffffd0),__d);
    QBasicTimer::start((QBasicTimer *)__d,in_RDI,(QObject *)0x718847);
    *(undefined1 *)(in_RDI.__r + 0x34) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontCache::increaseCost(uint cost)
{
    cost = (cost + 512) / 1024; // store cost in kb
    cost = cost > 0 ? cost : 1;
    total_cost += cost;

    FC_DEBUG("  COST: increased %u kb, total_cost %u kb, max_cost %u kb",
            cost, total_cost, max_cost);

    if (total_cost > max_cost) {
        max_cost = total_cost;

        if (!autoClean)
            return;

        if (!timer.isActive() || ! fast) {
            FC_DEBUG("  TIMER: starting fast timer (%d s)", static_cast<int>(fast_timeout.count()));

            timer.start(fast_timeout, this);
            fast = true;
        }
    }
}